

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O3

int __thiscall
qclab::qgates::CRotationZ<std::complex<float>_>::toQASM
          (CRotationZ<std::complex<float>_> *this,ostream *stream,int offset)

{
  int iVar1;
  RotationZ<std::complex<float>_> *pRVar2;
  int iVar3;
  int in_ECX;
  float fVar4;
  __string_type local_50;
  
  if ((this->super_QControlledGate2<std::complex<float>_>).controlState_ == 0) {
    qasm1_abi_cxx11_(&local_50,(qclab *)0x468b99,
                     (char *)(ulong)(uint)((this->super_QControlledGate2<std::complex<float>_>).
                                           control_ + offset),in_ECX);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (this->super_QControlledGate2<std::complex<float>_>).control_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[0xf])(this);
  iVar3 = iVar3 + offset;
  pRVar2 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_false>.
           _M_head_impl;
  fVar4 = atan2f((pRVar2->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_,
                 (pRVar2->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_);
  qasm2<float>(&local_50,"crz",iVar1 + offset,iVar3,fVar4 + fVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_QControlledGate2<std::complex<float>_>).controlState_ == 0) {
    qasm1_abi_cxx11_(&local_50,(qclab *)0x468b99,
                     (char *)(ulong)(uint)(offset + (this->
                                                  super_QControlledGate2<std::complex<float>_>).
                                                  control_),iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          stream << qasmCRz( this->control() + offset ,
                             this->target()  + offset , theta() ) ;
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          return 0 ;
        }